

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

ValidateXrHandleResult VerifyXrSpaceUserFBHandle(XrSpaceUserFB *handle_to_check)

{
  ValidateXrHandleResult VVar1;
  
  VVar1 = HandleInfoBase<XrSpaceUserFB_T_*,_GenValidUsageXrHandleInfo>::verifyHandle
                    (&g_spaceuserfb_info.
                      super_HandleInfoBase<XrSpaceUserFB_T_*,_GenValidUsageXrHandleInfo>,
                     handle_to_check);
  return VVar1;
}

Assistant:

ValidateXrHandleResult VerifyXrSpaceUserFBHandle(const XrSpaceUserFB* handle_to_check) {
    return g_spaceuserfb_info.verifyHandle(handle_to_check);
}